

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O3

void __thiscall Catch::XmlReporter::testRunEnded(XmlReporter *this,TestRunStats *testRunStats)

{
  XmlWriter *this_00;
  XmlWriter *this_01;
  StringRef name;
  StringRef name_00;
  StringRef name_01;
  StringRef name_02;
  StringRef name_03;
  StringRef name_04;
  StringRef name_05;
  StringRef name_06;
  ScopedElement local_50;
  pointer local_40 [2];
  _Alloc_hider local_30;
  
  (this->super_StreamingReporterBase).currentTestCaseInfo = (TestCaseInfo *)0x0;
  local_40[0] = (pointer)&local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"OverallResults","");
  this_01 = &this->m_xml;
  XmlWriter::scopedElement((XmlWriter *)&local_50,(string *)this_01,(XmlFormatting)local_40);
  this_00 = local_50.m_writer;
  name.m_size = 9;
  name.m_start = "successes";
  XmlWriter::writeAttribute<unsigned_long,void>
            (local_50.m_writer,name,(unsigned_long *)&testRunStats->totals);
  name_00.m_size = 8;
  name_00.m_start = "failures";
  XmlWriter::writeAttribute<unsigned_long,void>
            (this_00,name_00,&(testRunStats->totals).assertions.failed);
  name_01.m_size = 0x10;
  name_01.m_start = "expectedFailures";
  XmlWriter::writeAttribute<unsigned_long,void>
            (this_00,name_01,&(testRunStats->totals).assertions.failedButOk);
  name_02.m_size = 5;
  name_02.m_start = "skips";
  XmlWriter::writeAttribute<unsigned_long,void>
            (this_00,name_02,&(testRunStats->totals).assertions.skipped);
  XmlWriter::ScopedElement::~ScopedElement(&local_50);
  if (local_40[0] != (pointer)&local_30) {
    operator_delete(local_40[0],(ulong)(local_30._M_p + 1));
  }
  local_40[0] = (pointer)&local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"OverallResultsCases","");
  XmlWriter::scopedElement((XmlWriter *)&local_50,(string *)this_01,(XmlFormatting)local_40);
  name_03.m_size = 9;
  name_03.m_start = "successes";
  XmlWriter::writeAttribute<unsigned_long,void>
            (local_50.m_writer,name_03,&(testRunStats->totals).testCases.passed);
  name_04.m_size = 8;
  name_04.m_start = "failures";
  XmlWriter::writeAttribute<unsigned_long,void>
            (local_50.m_writer,name_04,&(testRunStats->totals).testCases.failed);
  name_05.m_size = 0x10;
  name_05.m_start = "expectedFailures";
  XmlWriter::writeAttribute<unsigned_long,void>
            (local_50.m_writer,name_05,&(testRunStats->totals).testCases.failedButOk);
  name_06.m_size = 5;
  name_06.m_start = "skips";
  XmlWriter::writeAttribute<unsigned_long,void>
            (local_50.m_writer,name_06,&(testRunStats->totals).testCases.skipped);
  XmlWriter::ScopedElement::~ScopedElement(&local_50);
  if (local_40[0] != (pointer)&local_30) {
    operator_delete(local_40[0],(ulong)(local_30._M_p + 1));
  }
  XmlWriter::endElement(this_01,Newline|Indent);
  return;
}

Assistant:

void XmlReporter::testRunEnded( TestRunStats const& testRunStats ) {
        StreamingReporterBase::testRunEnded( testRunStats );
        m_xml.scopedElement( "OverallResults" )
            .writeAttribute( "successes"_sr, testRunStats.totals.assertions.passed )
            .writeAttribute( "failures"_sr, testRunStats.totals.assertions.failed )
            .writeAttribute( "expectedFailures"_sr, testRunStats.totals.assertions.failedButOk )
            .writeAttribute( "skips"_sr, testRunStats.totals.assertions.skipped );
        m_xml.scopedElement( "OverallResultsCases")
            .writeAttribute( "successes"_sr, testRunStats.totals.testCases.passed )
            .writeAttribute( "failures"_sr, testRunStats.totals.testCases.failed )
            .writeAttribute( "expectedFailures"_sr, testRunStats.totals.testCases.failedButOk )
            .writeAttribute( "skips"_sr, testRunStats.totals.testCases.skipped );
        m_xml.endElement();
    }